

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void duplicate_objects_sel_repeat_proc(Am_Object *command_obj)

{
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Am_Object(&local_20,command_obj);
  Am_Value::Am_Value(&local_18,&Am_No_Value);
  duplicate_general_repeat(&local_20,false,&local_18);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, duplicate_objects_sel_repeat,
                 (Am_Object command_obj))
{
  duplicate_general_repeat(command_obj, false, Am_No_Value);
}